

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O0

void condvar_signal(worker_config_conflict *c,int *flag)

{
  int64_t eval_b;
  int64_t eval_a;
  int *flag_local;
  worker_config_conflict *c_local;
  
  uv_sem_wait(c);
  uv_mutex_lock(&c->mutex);
  if ((long)*flag != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
            ,0x5a,"*flag","==","0",(long)*flag,"==",0);
    abort();
  }
  *flag = 1;
  if (c->use_broadcast == 0) {
    uv_cond_signal(&c->cond);
  }
  else {
    uv_cond_broadcast(&c->cond);
  }
  uv_mutex_unlock(&c->mutex);
  uv_sem_post(&c->sem_signaled);
  return;
}

Assistant:

static void condvar_signal(worker_config* c, int* flag) {
  /* Wait until waiter holds mutex and is preparing to wait. */
  uv_sem_wait(&c->sem_waiting);

  /* Make sure waiter has begun waiting. */
  uv_mutex_lock(&c->mutex);

  /* Help waiter differentiate between spurious and legitimate wakeup. */
  ASSERT_OK(*flag);
  *flag = 1;

  if (c->use_broadcast)
    uv_cond_broadcast(&c->cond);
  else
    uv_cond_signal(&c->cond);

  uv_mutex_unlock(&c->mutex);

  /* Done signaling. */
  uv_sem_post(&c->sem_signaled);
}